

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

Symbols * Preprocessor::macroExpandIdentifier
                    (Preprocessor *that,SymbolStack *symbols,int lineNum,QByteArray *macroName)

{
  QByteArrayView after;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Token TVar4;
  Symbol *pSVar5;
  size_type sVar6;
  qsizetype qVar7;
  QVarLengthArray<QList<Symbol>,_5LL> *pQVar8;
  Symbol *pSVar9;
  QList<Symbol> *this;
  int in_ECX;
  QSet<QByteArray> *in_RDX;
  char *in_RSI;
  Symbols *in_RDI;
  long in_FS_OFFSET;
  Symbols *arg_3;
  Symbols *arg_2;
  Symbol *sym;
  Symbols *__range5;
  Symbols *arg_1;
  qsizetype index;
  Symbol *s_1;
  Mode mode;
  Token t;
  bool vararg;
  int nesting;
  bool haveSpace;
  Macro *macro;
  Symbols *syms;
  QByteArray lexem;
  Symbol last;
  Symbol next;
  const_iterator __end5;
  const_iterator __begin5;
  QByteArray stringified;
  qsizetype idx;
  Symbols arg;
  const_iterator lastSym;
  const_iterator it;
  const_iterator end;
  Symbols argument;
  Symbols expansion;
  Symbol s;
  QVarLengthArray<QList<Symbol>,_5LL> arguments;
  const_iterator in_stack_fffffffffffffaa8;
  const_iterator in_stack_fffffffffffffab0;
  QVarLengthArray<QList<Symbol>,_5LL> *in_stack_fffffffffffffab8;
  QVarLengthArray<QList<Symbol>,_5LL> *in_stack_fffffffffffffac0;
  undefined7 in_stack_fffffffffffffac8;
  char in_stack_fffffffffffffacf;
  Symbols *in_stack_fffffffffffffad0;
  QVarLengthArray<QList<Symbol>,_5LL> *in_stack_fffffffffffffad8;
  char *in_stack_fffffffffffffae8;
  int in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf4;
  QVarLengthArray<QList<Symbol>,_5LL> *in_stack_fffffffffffffaf8;
  char *in_stack_fffffffffffffb08;
  Parser *in_stack_fffffffffffffb10;
  bool local_4a9;
  int local_454;
  int local_448;
  int local_438;
  undefined1 local_358 [48];
  undefined1 local_328 [136];
  Symbol *local_2a0;
  const_iterator local_298;
  const_iterator local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  Symbol local_270;
  const_iterator local_240;
  Symbol *local_238;
  Symbol *local_230;
  const_iterator local_228;
  const_iterator local_220;
  const_iterator local_218;
  undefined1 local_210 [24];
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  QList<Symbol> local_198 [3];
  byte local_140;
  byte local_13f;
  QList<Symbol> aQStack_138 [4];
  undefined1 local_c8 [4];
  int local_c4;
  QVarLengthArray<QList<Symbol>,_5LL> local_98;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_c8,0xaa,0x30);
  SymbolStack::symbol((SymbolStack *)in_stack_fffffffffffffab0.i);
  Symbol::Symbol(in_stack_fffffffffffffab0.i,in_stack_fffffffffffffaa8.i);
  bVar2 = false;
  bVar3 = false;
  local_4a9 = true;
  if (local_c4 == 1) {
    Symbol::operator_cast_to_SubArray(in_stack_fffffffffffffaa8.i);
    bVar2 = true;
    bVar1 = QHash<SubArray,_Macro>::contains
                      ((QHash<SubArray,_Macro> *)in_stack_fffffffffffffab8,
                       (SubArray *)in_stack_fffffffffffffab0.i);
    local_4a9 = true;
    if (bVar1) {
      Symbol::lexem(in_stack_fffffffffffffaa8.i);
      bVar3 = true;
      local_4a9 = SymbolStack::dontReplaceSymbol
                            ((SymbolStack *)
                             CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8),
                             (QByteArray *)in_stack_fffffffffffffac0);
    }
  }
  if (bVar3) {
    QByteArray::~QByteArray((QByteArray *)0x167d0d);
  }
  if (bVar2) {
    SubArray::~SubArray((SubArray *)0x167d26);
  }
  if (local_4a9 == false) {
    Symbol::operator_cast_to_SubArray(in_stack_fffffffffffffaa8.i);
    QHash<SubArray,_Macro>::value
              ((QHash<SubArray,_Macro> *)
               CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8),
               (SubArray *)in_stack_fffffffffffffac0);
    SubArray::~SubArray((SubArray *)0x167dc5);
    Symbol::lexem(in_stack_fffffffffffffaa8.i);
    QByteArray::operator=
              ((QByteArray *)in_stack_fffffffffffffab0.i,(QByteArray *)in_stack_fffffffffffffaa8.i);
    QByteArray::~QByteArray((QByteArray *)0x167e0c);
    local_198[0].d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_198[0].d.ptr = (Symbol *)&DAT_aaaaaaaaaaaaaaaa;
    local_198[0].d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QList<Symbol>::QList((QList<Symbol> *)0x167e46);
    if ((local_140 & 1) == 0) {
      QList<Symbol>::operator=
                ((QList<Symbol> *)in_stack_fffffffffffffab0.i,
                 (QList<Symbol> *)in_stack_fffffffffffffaa8.i);
LAB_00168d3b:
      QList<Symbol>::QList
                ((QList<Symbol> *)in_stack_fffffffffffffab0.i,
                 (QList<Symbol> *)in_stack_fffffffffffffaa8.i);
    }
    else {
      bVar3 = false;
      while (bVar2 = SymbolStack::test((SymbolStack *)in_stack_fffffffffffffad8,
                                       (Token)((ulong)in_stack_fffffffffffffad0 >> 0x20)), bVar2) {
        bVar3 = true;
      }
      bVar2 = SymbolStack::test((SymbolStack *)in_stack_fffffffffffffad8,
                                (Token)((ulong)in_stack_fffffffffffffad0 >> 0x20));
      if (bVar2) {
        memset(&local_98,0xaa,0x90);
        QVarLengthArray<QList<Symbol>,_5LL>::QVarLengthArray(&local_98);
        do {
          bVar3 = SymbolStack::hasNext
                            ((SymbolStack *)
                             CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8));
          if (!bVar3) break;
          local_1f8 = &DAT_aaaaaaaaaaaaaaaa;
          local_1f0 = &DAT_aaaaaaaaaaaaaaaa;
          local_1e8 = &DAT_aaaaaaaaaaaaaaaa;
          QList<Symbol>::QList((QList<Symbol> *)0x168034);
          do {
            bVar3 = SymbolStack::test((SymbolStack *)in_stack_fffffffffffffad8,
                                      (Token)((ulong)in_stack_fffffffffffffad0 >> 0x20));
          } while (bVar3);
          local_448 = 0;
          bVar3 = false;
          if ((local_13f & 1) != 0) {
            in_stack_fffffffffffffb10 = (Parser *)QVLABaseBase::size((QVLABaseBase *)&local_98);
            qVar7 = QList<Symbol>::size(aQStack_138);
            bVar3 = in_stack_fffffffffffffb10 == (Parser *)(qVar7 + -1);
          }
          while (bVar2 = SymbolStack::hasNext
                                   ((SymbolStack *)
                                    CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8)),
                bVar2) {
            TVar4 = SymbolStack::next((SymbolStack *)in_stack_fffffffffffffad0);
            if (TVar4 == LPAREN) {
              local_448 = local_448 + 1;
            }
            else if (TVar4 == PP_RPAREN) {
              local_448 = local_448 + -1;
              if (local_448 < 0) break;
            }
            else if (((TVar4 == COMMA) && (local_448 == 0)) && (!bVar3)) break;
            SymbolStack::symbol((SymbolStack *)in_stack_fffffffffffffab0.i);
            QList<Symbol>::operator+=
                      ((QList<Symbol> *)in_stack_fffffffffffffab0.i,in_stack_fffffffffffffaa8.i);
          }
          QVarLengthArray<QList<Symbol>,_5LL>::operator+=
                    ((QVarLengthArray<QList<Symbol>,_5LL> *)in_stack_fffffffffffffab0.i,
                     (QList<Symbol> *)in_stack_fffffffffffffaa8.i);
          if (local_448 < 0) {
            local_438 = 5;
          }
          else {
            bVar3 = SymbolStack::hasNext
                              ((SymbolStack *)
                               CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8));
            if (!bVar3) {
              if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
                Parser::error(in_stack_fffffffffffffb10,in_RSI);
              }
              goto LAB_00168da8;
            }
            local_438 = 0;
          }
          QList<Symbol>::~QList((QList<Symbol> *)0x1681fa);
        } while (local_438 == 0);
        if ((local_13f & 1) != 0) {
          sVar6 = QVLABaseBase::size((QVLABaseBase *)&local_98);
          qVar7 = QList<Symbol>::size(aQStack_138);
          if (sVar6 == qVar7 + -1) {
            memset(local_210,0,0x18);
            QList<Symbol>::QList((QList<Symbol> *)0x168271);
            QVarLengthArray<QList<Symbol>,_5LL>::operator+=
                      ((QVarLengthArray<QList<Symbol>,_5LL> *)in_stack_fffffffffffffab0.i,
                       (QList<Symbol> *)in_stack_fffffffffffffaa8.i);
            QList<Symbol>::~QList((QList<Symbol> *)0x168293);
          }
        }
        local_454 = 0;
        local_218.i = (Symbol *)&DAT_aaaaaaaaaaaaaaaa;
        local_218 = QList<Symbol>::cend(in_stack_fffffffffffffab0.i);
        local_220.i = (Symbol *)&DAT_aaaaaaaaaaaaaaaa;
        local_220 = QList<Symbol>::cbegin(in_stack_fffffffffffffab0.i);
        local_228.i = (Symbol *)&DAT_aaaaaaaaaaaaaaaa;
        QList<Symbol>::cend((QList<Symbol> *)in_stack_fffffffffffffab0.i);
        QList<Symbol>::isEmpty((QList<Symbol> *)0x168327);
        local_228 = std::prev<QList<Symbol>::const_iterator>
                              (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8.i);
        while( true ) {
          local_230 = local_218.i;
          bVar3 = QList<Symbol>::const_iterator::operator!=(&local_220,local_218);
          if (!bVar3) break;
          pSVar5 = QList<Symbol>::const_iterator::operator*(&local_220);
          if ((pSVar5->token == HASH) || (pSVar5->token == PP_HASHHASH)) {
            local_454 = 2;
            if (pSVar5->token == HASH) {
              local_454 = 1;
            }
          }
          else {
            pQVar8 = (QVarLengthArray<QList<Symbol>,_5LL> *)
                     QListSpecialMethodsBase<Symbol>::indexOf<Symbol>
                               ((QListSpecialMethodsBase<Symbol> *)in_stack_fffffffffffffab0.i,
                                in_stack_fffffffffffffaa8.i,0x16840f);
            if (local_454 == 0) {
              if (((long)pQVar8 < 0) ||
                 (sVar6 = QVLABaseBase::size((QVLABaseBase *)&local_98),
                 in_stack_fffffffffffffaf8 = pQVar8, sVar6 <= (long)pQVar8)) {
                QList<Symbol>::operator+=
                          ((QList<Symbol> *)in_stack_fffffffffffffab0.i,in_stack_fffffffffffffaa8.i)
                ;
              }
              else {
                local_238 = local_228.i;
                bVar3 = QList<Symbol>::const_iterator::operator==(&local_220,local_228);
                in_stack_fffffffffffffaf4 = CONCAT13(1,(int3)in_stack_fffffffffffffaf4);
                if (!bVar3) {
                  local_270.len = (qsizetype)local_220.i;
                  local_240 = std::next<QList<Symbol>::const_iterator>
                                        (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8.i);
                  pSVar5 = QList<Symbol>::const_iterator::operator->(&local_240);
                  in_stack_fffffffffffffaf4 =
                       CONCAT13(pSVar5->token != PP_HASHHASH,(int3)in_stack_fffffffffffffaf4);
                }
                if ((char)((uint)in_stack_fffffffffffffaf4 >> 0x18) == '\0') {
                  QVarLengthArray<QList<Symbol>,_5LL>::at
                            ((QVarLengthArray<QList<Symbol>,_5LL> *)in_stack_fffffffffffffab0.i,
                             (qsizetype)in_stack_fffffffffffffaa8.i);
                  QList<Symbol>::operator+=
                            ((QList<Symbol> *)in_stack_fffffffffffffab0.i,
                             (QList<Symbol> *)in_stack_fffffffffffffaa8.i);
                  in_stack_fffffffffffffaf8 = pQVar8;
                }
                else {
                  local_270.lex.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
                  local_270.lex.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                  local_270.from = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                  QVarLengthArray<QList<Symbol>,_5LL>::at
                            ((QVarLengthArray<QList<Symbol>,_5LL> *)in_stack_fffffffffffffab0.i,
                             (qsizetype)in_stack_fffffffffffffaa8.i);
                  QList<Symbol>::QList
                            ((QList<Symbol> *)in_stack_fffffffffffffab0.i,
                             (QList<Symbol> *)in_stack_fffffffffffffaa8.i);
                  local_270.lex.d.d = (Data *)0x1;
                  in_stack_fffffffffffffae8 = in_RSI;
                  in_stack_fffffffffffffaf0 = in_ECX;
                  SymbolStack::excludeSymbols((SymbolStack *)in_stack_fffffffffffffad8);
                  in_stack_fffffffffffffaa8.i = &local_270;
                  macroExpand(in_stack_fffffffffffffad0,
                              (Preprocessor *)
                              CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8),
                              (Symbols *)in_stack_fffffffffffffac0,
                              (qsizetype *)in_stack_fffffffffffffab8,
                              (int)((ulong)in_stack_fffffffffffffab0.i >> 0x20),
                              SUB81((ulong)in_stack_fffffffffffffab0.i >> 0x18,0),in_RDX);
                  QSet<QByteArray>::~QSet((QSet<QByteArray> *)0x1685b1);
                  QList<Symbol>::~QList((QList<Symbol> *)0x1685be);
                  in_stack_fffffffffffffaf8 = pQVar8;
                }
              }
            }
            else if (local_454 == 1) {
              if ((long)pQVar8 < 0) {
                if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
                  Parser::error(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
                }
                goto LAB_00168da8;
              }
              sVar6 = QVLABaseBase::size((QVLABaseBase *)&local_98);
              if (sVar6 <= (long)pQVar8) {
                if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
                  Parser::error(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
                }
                goto LAB_00168da8;
              }
              QVarLengthArray<QList<Symbol>,_5LL>::at
                        ((QVarLengthArray<QList<Symbol>,_5LL> *)in_stack_fffffffffffffab0.i,
                         (qsizetype)in_stack_fffffffffffffaa8.i);
              local_288 = &DAT_aaaaaaaaaaaaaaaa;
              local_280 = &DAT_aaaaaaaaaaaaaaaa;
              local_278 = &DAT_aaaaaaaaaaaaaaaa;
              QByteArray::QByteArray((QByteArray *)0x16871c);
              local_290.i = (Symbol *)&DAT_aaaaaaaaaaaaaaaa;
              local_290 = QList<Symbol>::begin(in_stack_fffffffffffffab0.i);
              local_298.i = (Symbol *)&DAT_aaaaaaaaaaaaaaaa;
              local_298 = QList<Symbol>::end(in_stack_fffffffffffffab0.i);
              while( true ) {
                local_2a0 = local_298.i;
                bVar3 = QList<Symbol>::const_iterator::operator!=(&local_290,local_298);
                if (!bVar3) break;
                QList<Symbol>::const_iterator::operator*(&local_290);
                Symbol::lexem(in_stack_fffffffffffffaa8.i);
                QByteArray::operator+=
                          ((QByteArray *)in_stack_fffffffffffffab0.i,
                           (QByteArray *)in_stack_fffffffffffffaa8.i);
                QByteArray::~QByteArray((QByteArray *)0x16880f);
                QList<Symbol>::const_iterator::operator++(&local_290);
              }
              QByteArrayView::QByteArrayView<3ul>
                        ((QByteArrayView *)in_stack_fffffffffffffac0,
                         (char (*) [3])in_stack_fffffffffffffab8);
              after.m_size._4_4_ = in_stack_fffffffffffffaf4;
              after.m_size._0_4_ = in_stack_fffffffffffffaf0;
              after.m_data = (storage_type *)in_stack_fffffffffffffaf8;
              QByteArray::replace((QByteArray *)in_stack_fffffffffffffab8,
                                  (char)((ulong)in_stack_fffffffffffffae8 >> 0x38),after);
              QByteArray::prepend((QByteArray *)in_stack_fffffffffffffab0.i,
                                  in_stack_fffffffffffffacf);
              QByteArray::append((char)&local_288);
              Symbol::Symbol((Symbol *)in_stack_fffffffffffffac0,
                             (int)((ulong)in_stack_fffffffffffffab8 >> 0x20),
                             (Token)in_stack_fffffffffffffab8,
                             (QByteArray *)in_stack_fffffffffffffab0.i);
              QList<Symbol>::operator+=
                        ((QList<Symbol> *)in_stack_fffffffffffffab0.i,in_stack_fffffffffffffaa8.i);
              Symbol::~Symbol((Symbol *)0x1688be);
              QByteArray::~QByteArray((QByteArray *)0x1688cb);
              in_stack_fffffffffffffad8 = pQVar8;
            }
            else if (local_454 == 2) {
              if (pSVar5->token == PP_WHITESPACE) goto LAB_00168cda;
              while( true ) {
                qVar7 = QList<Symbol>::size(local_198);
                in_stack_fffffffffffffacf = false;
                if (qVar7 != 0) {
                  pSVar9 = QList<Symbol>::constLast(in_stack_fffffffffffffaa8.i);
                  in_stack_fffffffffffffacf = pSVar9->token == PP_WHITESPACE;
                }
                if ((bool)in_stack_fffffffffffffacf == false) break;
                QList<Symbol>::pop_back((QList<Symbol> *)0x168944);
              }
              memset(local_328,0xaa,0x30);
              Symbol::Symbol(in_stack_fffffffffffffab0.i,in_stack_fffffffffffffaa8.i);
              if (((long)pQVar8 < 0) ||
                 (in_stack_fffffffffffffac0 = pQVar8,
                 sVar6 = QVLABaseBase::size((QVLABaseBase *)&local_98),
                 sVar6 <= (long)in_stack_fffffffffffffac0)) {
LAB_00168a26:
                bVar3 = QList<Symbol>::isEmpty((QList<Symbol> *)0x168a33);
                if (((bVar3) ||
                    (pSVar9 = QList<Symbol>::constLast(in_stack_fffffffffffffaa8.i),
                    pSVar9->token != pSVar5->token)) ||
                   (pSVar5 = QList<Symbol>::constLast(in_stack_fffffffffffffaa8.i),
                   pSVar5->token == PP_STRING_LITERAL)) {
                  QList<Symbol>::operator+=
                            ((QList<Symbol> *)in_stack_fffffffffffffab0.i,
                             in_stack_fffffffffffffaa8.i);
                }
                else {
                  memset(local_358,0xaa,0x30);
                  QList<Symbol>::takeLast
                            ((QList<Symbol> *)
                             CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8));
                  Symbol::lexem(in_stack_fffffffffffffaa8.i);
                  Symbol::lexem(in_stack_fffffffffffffaa8.i);
                  ::operator+((QByteArray *)in_stack_fffffffffffffab8,
                              (QByteArray *)in_stack_fffffffffffffab0.i);
                  ::QStringBuilder::operator_cast_to_QByteArray
                            ((QStringBuilder<QByteArray,_QByteArray> *)in_stack_fffffffffffffaa8.i);
                  QStringBuilder<QByteArray,_QByteArray>::~QStringBuilder
                            ((QStringBuilder<QByteArray,_QByteArray> *)in_stack_fffffffffffffab0.i);
                  QByteArray::~QByteArray((QByteArray *)0x168b42);
                  QByteArray::~QByteArray((QByteArray *)0x168b4f);
                  Symbol::Symbol((Symbol *)in_stack_fffffffffffffac0,
                                 (int)((ulong)in_stack_fffffffffffffab8 >> 0x20),
                                 (Token)in_stack_fffffffffffffab8,
                                 (QByteArray *)in_stack_fffffffffffffab0.i);
                  QList<Symbol>::operator+=
                            ((QList<Symbol> *)in_stack_fffffffffffffab0.i,
                             in_stack_fffffffffffffaa8.i);
                  Symbol::~Symbol((Symbol *)0x168b94);
                  QByteArray::~QByteArray((QByteArray *)0x168ba1);
                  Symbol::~Symbol((Symbol *)0x168bae);
                }
                if ((-1 < (long)pQVar8) &&
                   (sVar6 = QVLABaseBase::size((QVLABaseBase *)&local_98),
                   in_stack_fffffffffffffab8 = pQVar8, (long)pQVar8 < sVar6)) {
                  QVarLengthArray<QList<Symbol>,_5LL>::at
                            ((QVarLengthArray<QList<Symbol>,_5LL> *)in_stack_fffffffffffffab0.i,
                             (qsizetype)in_stack_fffffffffffffaa8.i);
                  bVar3 = QList<Symbol>::isEmpty((QList<Symbol> *)0x168c3b);
                  in_stack_fffffffffffffab8 = pQVar8;
                  if (!bVar3) {
                    QList<Symbol>::cbegin((QList<Symbol> *)in_stack_fffffffffffffab0.i);
                    QList<Symbol>::const_iterator::operator+
                              ((const_iterator *)in_stack_fffffffffffffab0.i,
                               (qsizetype)in_stack_fffffffffffffaa8.i);
                    QList<Symbol>::cend((QList<Symbol> *)in_stack_fffffffffffffab0.i);
                    QList<Symbol>::append
                              ((QList<Symbol> *)0x168ca0,in_stack_fffffffffffffab0,
                               in_stack_fffffffffffffaa8);
                    in_stack_fffffffffffffab8 = pQVar8;
                  }
                }
                local_438 = 0;
              }
              else {
                this = QVarLengthArray<QList<Symbol>,_5LL>::at
                                 ((QVarLengthArray<QList<Symbol>,_5LL> *)in_stack_fffffffffffffab0.i
                                  ,(qsizetype)in_stack_fffffffffffffaa8.i);
                qVar7 = QList<Symbol>::size(this);
                if (qVar7 != 0) {
                  QList<Symbol>::at((QList<Symbol> *)in_stack_fffffffffffffab0.i,
                                    (qsizetype)in_stack_fffffffffffffaa8.i);
                  Symbol::operator=(in_stack_fffffffffffffab0.i,in_stack_fffffffffffffaa8.i);
                  goto LAB_00168a26;
                }
                local_454 = 0;
                local_438 = 0xc;
              }
              Symbol::~Symbol((Symbol *)0x168cba);
              if (local_438 != 0) goto LAB_00168cda;
            }
            local_454 = 0;
          }
LAB_00168cda:
          QList<Symbol>::const_iterator::operator++(&local_220);
        }
        if (local_454 != 0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            Parser::error(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
          }
          goto LAB_00168da8;
        }
        QVarLengthArray<QList<Symbol>,_5LL>::~QVarLengthArray(in_stack_fffffffffffffac0);
        goto LAB_00168d3b;
      }
      QByteArray::QByteArray((QByteArray *)0x167ec2);
      QByteArray::operator=
                ((QByteArray *)in_stack_fffffffffffffab0.i,(QByteArray *)in_stack_fffffffffffffaa8.i
                );
      QByteArray::~QByteArray((QByteArray *)0x167ee4);
      (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      (in_RDI->d).ptr = (Symbol *)&DAT_aaaaaaaaaaaaaaaa;
      (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QList<Symbol>::QList((QList<Symbol> *)0x167f19);
      if (bVar3) {
        Symbol::Symbol(in_stack_fffffffffffffab0.i,(int)((ulong)in_stack_fffffffffffffaa8.i >> 0x20)
                       ,(Token)in_stack_fffffffffffffaa8.i);
        QList<Symbol>::operator+=
                  ((QList<Symbol> *)in_stack_fffffffffffffab0.i,in_stack_fffffffffffffaa8.i);
        Symbol::~Symbol((Symbol *)0x167f5e);
      }
      QList<Symbol>::operator+=
                ((QList<Symbol> *)in_stack_fffffffffffffab0.i,in_stack_fffffffffffffaa8.i);
      pSVar5 = QList<Symbol>::last(in_stack_fffffffffffffaa8.i);
      pSVar5->lineNum = in_ECX;
    }
    QList<Symbol>::~QList((QList<Symbol> *)0x168d68);
    Macro::~Macro((Macro *)in_stack_fffffffffffffab0.i);
  }
  else {
    memset(in_RDI,0,0x18);
    QList<Symbol>::QList((QList<Symbol> *)0x167d54);
  }
  Symbol::~Symbol((Symbol *)0x168d82);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
LAB_00168da8:
  __stack_chk_fail();
}

Assistant:

Symbols Preprocessor::macroExpandIdentifier(Preprocessor *that, SymbolStack &symbols, int lineNum, QByteArray *macroName)
{
    Symbol s = symbols.symbol();

    // not a macro
    if (s.token != PP_IDENTIFIER || !that->macros.contains(s) || symbols.dontReplaceSymbol(s.lexem())) {
        return Symbols();
    }

    const Macro &macro = that->macros.value(s);
    *macroName = s.lexem();

    Symbols expansion;
    if (!macro.isFunction) {
        expansion = macro.symbols;
    } else {
        bool haveSpace = false;
        while (symbols.test(PP_WHITESPACE)) { haveSpace = true; }
        if (!symbols.test(PP_LPAREN)) {
            *macroName = QByteArray();
            Symbols syms;
            if (haveSpace)
                syms += Symbol(lineNum, PP_WHITESPACE);
            syms += s;
            syms.last().lineNum = lineNum;
            return syms;
        }
        QVarLengthArray<Symbols, 5> arguments;
        while (symbols.hasNext()) {
            Symbols argument;
            // strip leading space
            while (symbols.test(PP_WHITESPACE)) {}
            int nesting = 0;
            bool vararg = macro.isVariadic && (arguments.size() == macro.arguments.size() - 1);
            while (symbols.hasNext()) {
                Token t = symbols.next();
                if (t == PP_LPAREN) {
                    ++nesting;
                } else if (t == PP_RPAREN) {
                    --nesting;
                    if (nesting < 0)
                        break;
                } else if (t == PP_COMMA && nesting == 0) {
                    if (!vararg)
                        break;
                }
                argument += symbols.symbol();
            }
            arguments += argument;

            if (nesting < 0)
                break;
            else if (!symbols.hasNext())
                that->error("missing ')' in macro usage");
        }

        // empty VA_ARGS
        if (macro.isVariadic && arguments.size() == macro.arguments.size() - 1)
            arguments += Symbols();

        // now replace the macro arguments with the expanded arguments
        enum Mode {
            Normal,
            Hash,
            HashHash
        } mode = Normal;

        const auto end = macro.symbols.cend();
        auto it = macro.symbols.cbegin();
        const auto lastSym = std::prev(macro.symbols.cend(), !macro.symbols.isEmpty() ? 1 : 0);
        for (; it != end; ++it) {
            const Symbol &s = *it;
            if (s.token == HASH || s.token == PP_HASHHASH) {
                mode = (s.token == HASH ? Hash : HashHash);
                continue;
            }
            const qsizetype index = macro.arguments.indexOf(s);
            if (mode == Normal) {
                if (index >= 0 && index < arguments.size()) {
                    // each argument undoergoes macro expansion if it's not used as part of a # or ##
                    if (it == lastSym || std::next(it)->token != PP_HASHHASH) {
                        Symbols arg = arguments.at(index);
                        qsizetype idx = 1;
                        macroExpand(&expansion, that, arg, idx, lineNum, false, symbols.excludeSymbols());
                    } else {
                        expansion += arguments.at(index);
                    }
               } else {
                    expansion += s;
                }
            } else if (mode == Hash) {
                if (index < 0) {
                    that->error("'#' is not followed by a macro parameter");
                    continue;
                } else if (index >= arguments.size()) {
                    that->error("Macro invoked with too few parameters for a use of '#'");
                    continue;
                }

                const Symbols &arg = arguments.at(index);
                QByteArray stringified;
                for (const Symbol &sym : arg)
                    stringified += sym.lexem();

                stringified.replace('"', "\\\"");
                stringified.prepend('"');
                stringified.append('"');
                expansion += Symbol(lineNum, STRING_LITERAL, stringified);
            } else if (mode == HashHash){
                if (s.token == WHITESPACE)
                    continue;

                while (expansion.size() && expansion.constLast().token == PP_WHITESPACE)
                    expansion.pop_back();

                Symbol next = s;
                if (index >= 0 && index < arguments.size()) {
                    const Symbols &arg = arguments.at(index);
                    if (arg.size() == 0) {
                        mode = Normal;
                        continue;
                    }
                    next = arg.at(0);
                }

                if (!expansion.isEmpty() && expansion.constLast().token == s.token
                    && expansion.constLast().token != STRING_LITERAL) {
                    Symbol last = expansion.takeLast();

                    QByteArray lexem = last.lexem() + next.lexem();
                    expansion += Symbol(lineNum, last.token, lexem);
                } else {
                    expansion += next;
                }

                if (index >= 0 && index < arguments.size()) {
                    const Symbols &arg = arguments.at(index);
                    if (!arg.isEmpty())
                        expansion.append(arg.cbegin() + 1, arg.cend());
                }
            }
            mode = Normal;
        }
        if (mode != Normal)
            that->error("'#' or '##' found at the end of a macro argument");

    }

    return expansion;
}